

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O0

int secp256r1sha256_sign(void *data,ptls_buffer_t *outbuf,ptls_iovec_t input)

{
  size_t sVar1;
  uECC_Curve curve;
  ulong body_size_00;
  size_t body_size;
  size_t body_start;
  undefined1 local_100 [8];
  cf_sha256_context ctx;
  uint8_t local_88 [4];
  int ret;
  uint8_t sig [64];
  uint8_t hash [32];
  ptls_buffer_t *outbuf_local;
  void *data_local;
  ptls_iovec_t input_local;
  
  cf_sha256_init((cf_sha256_context *)local_100);
  cf_sha256_update((cf_sha256_context *)local_100,input.base,input.len);
  cf_sha256_digest_final((cf_sha256_context *)local_100,sig + 0x38);
  (*ptls_clear_memory)(local_100,0x70);
  curve = uECC_secp256r1();
  uECC_sign((uint8_t *)data,sig + 0x38,0x20,local_88,curve);
  body_start._7_1_ = 0x30;
  ctx.npartial._4_4_ = ptls_buffer__do_pushv(outbuf,(void *)((long)&body_start + 7),1);
  if (ctx.npartial._4_4_ == 0) {
    body_start._6_1_ = 0xff;
    ctx.npartial._4_4_ = ptls_buffer__do_pushv(outbuf,(void *)((long)&body_start + 6),1);
    if (ctx.npartial._4_4_ == 0) {
      sVar1 = outbuf->off;
      ctx.npartial._4_4_ = ptls_buffer_push_asn1_ubigint(outbuf,local_88,0x20);
      if ((ctx.npartial._4_4_ == 0) &&
         (ctx.npartial._4_4_ = ptls_buffer_push_asn1_ubigint(outbuf,sig + 0x18,0x20),
         ctx.npartial._4_4_ == 0)) {
        body_size_00 = outbuf->off - sVar1;
        if (body_size_00 < 0x80) {
          outbuf->base[sVar1 - 1] = (uint8_t)body_size_00;
        }
        else {
          ctx.npartial._4_4_ = ptls_buffer__adjust_asn1_blocksize(outbuf,body_size_00);
          if (ctx.npartial._4_4_ != 0) goto LAB_0011c7f3;
        }
        ctx.npartial._4_4_ = 0;
      }
    }
  }
LAB_0011c7f3:
  (*ptls_clear_memory)(sig + 0x38,0x20);
  (*ptls_clear_memory)(local_88,0x40);
  return ctx.npartial._4_4_;
}

Assistant:

static int secp256r1sha256_sign(void *data, ptls_buffer_t *outbuf, ptls_iovec_t input)
{
    uint8_t hash[32], sig[64];
    int ret;

    { /* calc hash */
        cf_sha256_context ctx;
        cf_sha256_init(&ctx);
        cf_sha256_update(&ctx, input.base, input.len);
        cf_sha256_digest_final(&ctx, hash);
        ptls_clear_memory(&ctx, sizeof(ctx));
    }

    /* sign */
    uECC_sign(data, hash, sizeof(hash), sig, uECC_secp256r1());

    /* encode using DER */
    ptls_buffer_push_asn1_sequence(outbuf, {
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig, 32)) != 0)
            goto Exit;
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig + 32, 32)) != 0)
            goto Exit;
    });

    ret = 0;

Exit:
    ptls_clear_memory(hash, sizeof(hash));
    ptls_clear_memory(sig, sizeof(sig));
    return ret;
}